

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

void Bmc_MnaSelect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vLeaves)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  while( true ) {
    uVar3 = *(ulong *)pObj;
    if (-1 < (long)uVar3) {
      return;
    }
    *(ulong *)pObj = uVar3 & 0x7fffffffffffffff;
    if (pObj->Value != 3) {
      __assert_fail("pObj->Value == GIA_UND",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xc0,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    uVar4 = (uint)uVar3;
    if (((int)uVar4 < 0) || (uVar5 = uVar4 & 0x1fffffff, uVar5 == 0x1fffffff)) break;
    if (pObj[-(ulong)uVar5].Value == 3) {
      Bmc_MnaSelect_rec(p,pObj + -(ulong)uVar5,vLeaves);
    }
    else if (pObj[-(ulong)uVar5].Value + (uint)((uVar4 >> 0x1d & 1) != 0) != 2) {
      __assert_fail("Gia_ObjFanin0(pObj)->Value + Gia_ObjFaninC0(pObj) == GIA_ONE",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0xc5,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    uVar3 = *(ulong *)pObj;
    pObj = pObj + -(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff);
    if (pObj->Value != 3) {
      if (pObj->Value + (uint)((uVar3 >> 0x3d & 1) != 0) == 2) {
        return;
      }
      __assert_fail("Gia_ObjFanin1(pObj)->Value + Gia_ObjFaninC1(pObj) == GIA_ONE",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,200,"void Bmc_MnaSelect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
  }
  if ((uVar4 & 0x9fffffff) != 0x9fffffff) {
    return;
  }
  uVar4 = (uint)(uVar3 >> 0x20);
  if ((int)(uVar4 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
    return;
  }
  uVar4 = uVar4 & 0x1fffffff;
  iVar1 = p->vCis->nSize;
  if ((int)uVar4 < iVar1 - p->nRegs) {
    __assert_fail("Gia_ObjIsRo(p, pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = p->vCos->nSize;
  uVar4 = (iVar2 - iVar1) + uVar4;
  if ((-1 < (int)uVar4) && ((int)uVar4 < iVar2)) {
    iVar1 = p->vCos->pArray[uVar4];
    if ((-1 < iVar1) && (iVar1 < p->nObjs)) {
      Vec_IntPush(vLeaves,iVar1);
      return;
    }
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Bmc_MnaSelect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vLeaves )
{
    if ( !pObj->fPhase )
        return;
    pObj->fPhase = 0;
    assert( pObj->Value == GIA_UND );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value == GIA_UND )
            Bmc_MnaSelect_rec( p, Gia_ObjFanin0(pObj), vLeaves );
        else assert( Gia_ObjFanin0(pObj)->Value + Gia_ObjFaninC0(pObj) == GIA_ONE );
        if ( Gia_ObjFanin1(pObj)->Value == GIA_UND )
            Bmc_MnaSelect_rec( p, Gia_ObjFanin1(pObj), vLeaves );
        else assert( Gia_ObjFanin1(pObj)->Value + Gia_ObjFaninC1(pObj) == GIA_ONE );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vLeaves, Gia_ObjId(p, Gia_ObjRoToRi(p, pObj)) );
}